

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmState.cxx
# Opt level: O2

string * __thiscall
cmState::Snapshot::GetEntryPointCommand_abi_cxx11_(string *__return_storage_ptr__,Snapshot *this)

{
  PointerType pSVar1;
  
  pSVar1 = cmLinkedTree<cmState::SnapshotDataType>::iterator::operator->(&this->Position);
  std::__cxx11::string::string
            ((string *)__return_storage_ptr__,(string *)&pSVar1->EntryPointCommand);
  return __return_storage_ptr__;
}

Assistant:

std::string cmState::Snapshot::GetEntryPointCommand() const
{
  return this->Position->EntryPointCommand;
}